

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O1

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::default_busy_wait>_>
::Consume::start_consume_impl
          (Consume *this,
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *i_queue)

{
  __pointer_type pLVar1;
  ControlBlock *pCVar2;
  ulong uVar3;
  
  if (0xf < this->m_next_ptr) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
               ,0xb8);
  }
  if (((i_queue->m_head)._M_b._M_p == (__pointer_type)0x0) &&
     (pLVar1 = *(__pointer_type *)
                &(i_queue->
                 super_LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                 ).field_0x50, (i_queue->m_head)._M_b._M_p = pLVar1, pLVar1 == (__pointer_type)0x0))
  {
    uVar3 = 0;
  }
  else {
    this->m_queue =
         (LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::default_busy_wait>_>
          *)i_queue;
    pLVar1 = (i_queue->m_head)._M_b._M_p;
    this->m_control = pLVar1;
    uVar3 = pLVar1->m_next;
  }
  this->m_next_ptr = uVar3;
  while( true ) {
    if (uVar3 < 0x10) {
      return;
    }
    if ((uVar3 & 0xb) == 0) break;
    if (((uint)uVar3 & 3) == 2) {
      advance_head(this);
    }
    pCVar2 = (ControlBlock *)(this->m_next_ptr & 0xfffffffffffffff0);
    this->m_control = pCVar2;
    uVar3 = pCVar2->m_next;
    this->m_next_ptr = uVar3;
  }
  LOCK();
  this->m_control->m_next = uVar3 | 1;
  UNLOCK();
  *(byte *)&this->m_next_ptr = (byte)this->m_next_ptr | 2;
  return;
}

Assistant:

void start_consume_impl(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            /* found an element to consume, set LfQueue_Busy 
                                todo: the single consumer may probably avoid to do any further atomic
                                    operation on m_control->m_next */

                            raw_atomic_store(
                              &m_control->m_next, m_next_ptr | LfQueue_Busy, mem_relaxed);
                            m_next_ptr |=
                              LfQueue_Dead; /* this is what we will write in m_control->m_next
                                when (and if) we will commit the consume */
                            break;
                        }
                        else if ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                        {
                            advance_head();
                        }
                        move_next();
                    }
                }